

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::DestructorOnlyDisposer<capnp::compiler::LineBreakTable>::disposeImpl
          (DestructorOnlyDisposer<capnp::compiler::LineBreakTable> *this,void *pointer)

{
  void *pointer_local;
  DestructorOnlyDisposer<capnp::compiler::LineBreakTable> *this_local;
  
  capnp::compiler::LineBreakTable::~LineBreakTable((LineBreakTable *)pointer);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    reinterpret_cast<T*>(pointer)->~T();
  }